

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheDrop(PgHdr *p)

{
  PgHdr *in_RDI;
  
  if ((in_RDI->flags & 2) != 0) {
    pcacheManageDirtyList(in_RDI,'\x01');
  }
  in_RDI->pCache->nRef = in_RDI->pCache->nRef + -1;
  if (in_RDI->pgno == 1) {
    in_RDI->pCache->pPage1 = (PgHdr *)0x0;
  }
  (*sqlite3Config.pcache2.xUnpin)(in_RDI->pCache->pCache,in_RDI->pPage,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheDrop(PgHdr *p){
  assert( p->nRef==1 );
  if( p->flags&PGHDR_DIRTY ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_REMOVE);
  }
  p->pCache->nRef--;
  if( p->pgno==1 ){
    p->pCache->pPage1 = 0;
  }
  sqlite3GlobalConfig.pcache2.xUnpin(p->pCache->pCache, p->pPage, 1);
}